

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetSpillSize(Btree *p,int mxPage)

{
  int *piVar1;
  BtShared *pBVar2;
  PCache *pPVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar3 = pBVar2->pPager->pPCache;
  if (mxPage != 0) {
    if (mxPage < 0) {
      mxPage = (int)(((long)mxPage * -0x400) / ((long)pPVar3->szExtra + (long)pPVar3->szPage));
    }
    pPVar3->szSpill = mxPage;
  }
  lVar6 = (long)pPVar3->szCache;
  if (lVar6 < 0) {
    lVar4 = (lVar6 * -0x400) / ((long)pPVar3->szExtra + (long)pPVar3->szPage);
    lVar6 = 1000000000;
    if (lVar4 < 1000000000) {
      lVar6 = lVar4;
    }
  }
  iVar5 = pPVar3->szSpill;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (iVar5 < (int)lVar6) {
    iVar5 = (int)lVar6;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetSpillSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  int res;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  res = sqlite3PagerSetSpillsize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return res;
}